

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LzFind.cpp
# Opt level: O0

void crnlib::Bt2_MatchFinder_Skip(CMatchFinder *p,UInt32 num)

{
  uint lenLimit_00;
  UInt32 UVar1;
  UInt32 curMatch;
  Byte *cur;
  UInt32 hashValue;
  UInt32 lenLimit;
  UInt32 num_local;
  CMatchFinder *p_local;
  
  hashValue = num;
  do {
    lenLimit_00 = p->lenLimit;
    if (lenLimit_00 < 2) {
      MatchFinder_MovePos(p);
    }
    else {
      UVar1 = p->hash[(uint)*(ushort *)p->buffer];
      p->hash[(uint)*(ushort *)p->buffer] = p->pos;
      SkipMatchesSpec(lenLimit_00,UVar1,p->pos,p->buffer,p->son,p->cyclicBufferPos,
                      p->cyclicBufferSize,p->cutValue);
      p->cyclicBufferPos = p->cyclicBufferPos + 1;
      p->buffer = p->buffer + 1;
      UVar1 = p->pos + 1;
      p->pos = UVar1;
      if (UVar1 == p->posLimit) {
        MatchFinder_CheckLimits(p);
      }
    }
    hashValue = hashValue - 1;
  } while (hashValue != 0);
  return;
}

Assistant:

static void Bt2_MatchFinder_Skip(CMatchFinder* p, UInt32 num) {
  do {
    SKIP_HEADER(2)
    HASH2_CALC;
    curMatch = p->hash[hashValue];
    p->hash[hashValue] = p->pos;
    SKIP_FOOTER
  } while (--num != 0);
}